

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangular.cpp
# Opt level: O2

void calc<float>(options *opt)

{
  long lVar1;
  ostream *poVar2;
  ostream *this;
  invalid_argument *this_00;
  float Ja;
  float Jb;
  float Jc;
  float fVar3;
  float fVar4;
  float fVar5;
  root_type rVar6;
  fvar<float,_2UL> beta;
  fvar<float,_2UL> f;
  fvar<float,_2UL> fVar7;
  fvar<float,_2UL> beta_00;
  fvar<float,_2UL> beta_01;
  
  Ja = convert<float>(&opt->Ja);
  Jb = convert<float>(&opt->Jb);
  Jc = convert<float>(&opt->Jc);
  fVar3 = convert<float>(&opt->Tmin);
  fVar4 = convert<float>(&opt->Tmax);
  fVar5 = convert<float>(&opt->dT);
  lVar1 = std::cout;
  if (fVar4 < fVar3) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"Tmax should be larger than Tmin");
  }
  else {
    if (0.0 < fVar5) {
      *(uint *)(std::runtime_error::runtime_error + *(long *)(std::cout + -0x18)) =
           *(uint *)(std::runtime_error::runtime_error + *(long *)(std::cout + -0x18)) & 0xfffffefb
           | 0x100;
      *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(lVar1 + -0x18)) = 6;
      poVar2 = std::operator<<((ostream *)&std::cout,"# lattice: triangular\n");
      poVar2 = std::operator<<(poVar2,"# precision: ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,6);
      poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
      std::operator<<(poVar2,"# Lx Ly Ja Jb Jc T 1/T F/N E/N C/N\n");
      for (; fVar3 < fVar5 * 0.0001 + fVar4; fVar3 = fVar3 + fVar5) {
        beta.v._M_elems[0] = 1.0 / fVar3;
        beta.v._M_elems[1] = 1.0;
        beta.v._M_elems[2] = 0.0;
        f = ising::free_energy::triangular::
            infinite<float,boost::math::differentiation::autodiff_v1::detail::fvar<float,2ul>>
                      (Ja,Jb,Jc,beta);
        poVar2 = std::operator<<((ostream *)&std::cout,"inf inf ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,Ja);
        poVar2 = std::operator<<(poVar2,' ');
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,Jb);
        poVar2 = std::operator<<(poVar2,' ');
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,Jc);
        poVar2 = std::operator<<(poVar2,' ');
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,fVar3);
        poVar2 = std::operator<<(poVar2,' ');
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,beta.v._M_elems[0]);
        this = std::operator<<(poVar2,' ');
        fVar7.v._M_elems[1] = 1.0;
        fVar7.v._M_elems[0] = beta.v._M_elems[0];
        fVar7.v._M_elems[2] = 0.0;
        rVar6 = ising::free_energy::
                free_energy<boost::math::differentiation::autodiff_v1::detail::fvar<float,2ul>>
                          ((free_energy *)poVar2,f,fVar7);
        poVar2 = (ostream *)std::ostream::operator<<(this,rVar6);
        poVar2 = std::operator<<(poVar2,' ');
        beta_00.v._M_elems[1] = 1.0;
        beta_00.v._M_elems[0] = beta.v._M_elems[0];
        beta_00.v._M_elems[2] = 0.0;
        rVar6 = ising::free_energy::
                energy<boost::math::differentiation::autodiff_v1::detail::fvar<float,2ul>>
                          (f,beta_00);
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,rVar6);
        poVar2 = std::operator<<(poVar2,' ');
        beta_01.v._M_elems[1] = 1.0;
        beta_01.v._M_elems[0] = beta.v._M_elems[0];
        beta_01.v._M_elems[2] = 0.0;
        rVar6 = ising::free_energy::
                specific_heat<boost::math::differentiation::autodiff_v1::detail::fvar<float,2ul>>
                          (f,beta_01);
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,rVar6);
        std::endl<char,std::char_traits<char>>(poVar2);
      }
      return;
    }
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"dT should be positive");
  }
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void calc(const options &opt) {
  using namespace ising::free_energy;
  typedef T real_t;
  real_t Ja = convert<real_t>(opt.Ja);
  real_t Jb = convert<real_t>(opt.Jb);
  real_t Jc = convert<real_t>(opt.Jc);
  real_t Tmin = convert<real_t>(opt.Tmin);
  real_t Tmax = convert<real_t>(opt.Tmax);
  real_t dT = convert<real_t>(opt.dT);
  if (Tmin > Tmax)
    throw(std::invalid_argument("Tmax should be larger than Tmin"));
  if (dT <= 0)
    throw(std::invalid_argument("dT should be positive"));
  std::cout << std::scientific
            << std::setprecision(std::numeric_limits<real_t>::digits10)
            << "# lattice: triangular\n"
            << "# precision: " << std::numeric_limits<real_t>::digits10
            << std::endl
            << "# Lx Ly Ja Jb Jc T 1/T F/N E/N C/N\n";
  for (auto t = Tmin; t < Tmax + 1e-4 * dT; t += dT) {
    auto beta = boost::math::differentiation::make_fvar<real_t, 2>(1 / t);
    auto f = triangular::infinite(Ja, Jb, Jc, beta);
    std::cout << "inf inf " << Ja << ' ' << Jb << ' ' << Jc << ' ' << t << ' '
              << (1 / t) << ' ' << free_energy(f, beta) << ' '
              << energy(f, beta) << ' ' << specific_heat(f, beta) << std::endl;
  }
}